

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::BloomFilterHash::printTo(BloomFilterHash *this,ostream *out)

{
  string sStack_38;
  
  std::operator<<((ostream *)out,"BloomFilterHash(");
  std::operator<<((ostream *)out,"XXHASH=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<((ostream *)out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::XxHash>(&sStack_38,&this->XXHASH);
    std::operator<<((ostream *)out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::operator<<((ostream *)out,")");
  return;
}

Assistant:

void BloomFilterHash::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BloomFilterHash(";
  out << "XXHASH="; (__isset.XXHASH ? (out << to_string(XXHASH)) : (out << "<null>"));
  out << ")";
}